

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

void __thiscall
upb::generator::anon_unknown_2::GenerateFile
          (anon_unknown_2 *this,DefPoolPair *pools,FileDefPtr file,Options *options,
          GeneratorContext *context)

{
  _Rb_tree_header *p_Var1;
  ushort uVar2;
  upb_EnumValueDef *v;
  void *pvVar3;
  anon_union_8_3_dbd58ed1_for_sub aVar4;
  pointer pEVar5;
  pointer pEVar6;
  pointer pEVar7;
  _Bool _Var8;
  bool bVar9;
  char cVar10;
  int iVar11;
  upb_CType uVar12;
  int32_t iVar13;
  uint32_t uVar14;
  upb_FieldDef *puVar15;
  upb_FileDef *puVar16;
  upb_MessageDef *puVar17;
  upb_FileDef *puVar18;
  upb_MessageDef *m;
  char *pcVar19;
  mapped_type *pmVar20;
  upb_MessageDef *puVar21;
  _Base_ptr p_Var22;
  generator *pgVar23;
  compiler *pcVar24;
  long lVar25;
  size_t sVar26;
  upb_MiniTable *puVar27;
  long *plVar28;
  pointer pMVar29;
  upb_EnumDef *puVar30;
  _Rb_tree_header *p_Var31;
  FieldDefPtr FVar32;
  upb_FieldDef *puVar33;
  AlphaNum *options_00;
  char *pcVar34;
  FileDefPtr FVar35;
  char *extraout_RDX;
  upb_MessageDef *extraout_RDX_00;
  upb_MessageDef *extraout_RDX_01;
  upb_MessageDef *extraout_RDX_02;
  upb_MessageDef *extraout_RDX_03;
  upb_MessageDef *extraout_RDX_04;
  upb_MessageDef *extraout_RDX_05;
  MessageDefPtr MVar36;
  upb_FieldDef *extraout_RDX_06;
  upb_FieldDef *extraout_RDX_07;
  MessageDefPtr descriptor;
  upb_FieldDef *extraout_RDX_08;
  upb_FieldDef *extraout_RDX_09;
  upb_FieldDef *extraout_RDX_10;
  upb_FieldDef *extraout_RDX_11;
  MessageDefPtr descriptor_00;
  upb_FieldDef *extraout_RDX_12;
  FieldDefPtr field;
  MessageDefPtr descriptor_01;
  FieldDefPtr field_00;
  FieldDefPtr field_01;
  MessageDefPtr descriptor_02;
  upb_FieldDef *extraout_RDX_13;
  MessageDefPtr descriptor_03;
  FieldDefPtr field_02;
  MessageDefPtr descriptor_04;
  upb_FieldDef *extraout_RDX_14;
  upb_FieldDef *extraout_RDX_15;
  upb_FieldDef *extraout_RDX_16;
  upb_FieldDef *extraout_RDX_17;
  upb_FieldDef *extraout_RDX_18;
  FieldDefPtr field_03;
  FileDefPtr file_00;
  char *extraout_RDX_19;
  upb_FileDef *extraout_RDX_20;
  upb_FileDef *extraout_RDX_21;
  upb_FileDef *extraout_RDX_22;
  int i_1;
  pointer pMVar37;
  int i;
  int iVar38;
  pointer pFVar39;
  undefined8 uVar40;
  _Alloc_hider _Var41;
  pointer pEVar42;
  ulong uVar43;
  anon_union_8_2_184ffc0a_for_scope aVar44;
  pointer pFVar45;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view filename;
  string_view format_05;
  string_view format_06;
  string_view format_07;
  string_view format_08;
  string_view format_09;
  string_view format_10;
  string_view format_11;
  string_view format_12;
  string_view format_13;
  string_view format_14;
  string_view format_15;
  string_view format_16;
  string_view format_17;
  string_view format_18;
  string_view format_19;
  string_view format_20;
  string_view format_21;
  string_view format_22;
  string_view format_23;
  string_view format_24;
  string_view format_25;
  string_view format_26;
  string_view format_27;
  string_view format_28;
  string_view format_29;
  string_view format_30;
  string_view src;
  string_view src_00;
  string_view format_31;
  string_view filename_00;
  string_view format_32;
  string_view format_33;
  string_view format_34;
  string_view format_35;
  string_view format_36;
  string_view format_37;
  string_view format_38;
  string_view format_39;
  string_view format_40;
  string_view src_01;
  string_view filename_01;
  string_view filename_02;
  string_view proto_filename;
  string_view proto_filename_00;
  string_view proto_filename_01;
  string_view full_name;
  string_view full_name_00;
  string_view full_name_01;
  string_view full_name_02;
  string_view full_name_03;
  string_view full_name_04;
  string_view full_name_05;
  string_view full_name_06;
  string_view full_name_07;
  string_view filename_03;
  string_view proto_filename_02;
  string_view proto_filename_03;
  string_view proto_filename_04;
  string_view full_name_08;
  string_view full_name_09;
  string_view full_name_10;
  string_view full_name_11;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::MessageDefPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::MessageDefPtr>_>_>
  forward_messages_1;
  anon_union_8_2_184ffc0a_for_scope local_1b8;
  anon_union_8_3_dbd58ed1_for_sub local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  vector<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_> values;
  upb_MessageDef *local_168;
  Output resolve_calls;
  Output h_output;
  vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> this_file_messages;
  string local_f0;
  upb_MessageDef *local_d0;
  Output c_output;
  vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> forward_messages;
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> this_file_exts;
  vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> sorted_messages;
  vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> this_file_enums;
  char *local_38;
  
  h_output.output_._M_dataplus._M_p = (pointer)&h_output.output_.field_2;
  h_output.output_._M_string_length = 0;
  h_output.output_.field_2._M_local_buf[0] = '\0';
  SortedMessages(&sorted_messages,(FileDefPtr)pools);
  pMVar29 = sorted_messages.
            super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
            super__Vector_impl_data._M_finish;
  this_file_messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this_file_messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_file_messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (sorted_messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      sorted_messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pMVar37 = sorted_messages.
              super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      _Var8 = upb_MessageDef_IsMapEntry(pMVar37->ptr_);
      if (!_Var8) {
        if (this_file_messages.
            super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            this_file_messages.
            super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<upb::MessageDefPtr,std::allocator<upb::MessageDefPtr>>::
          _M_realloc_insert<upb::MessageDefPtr_const&>
                    ((vector<upb::MessageDefPtr,std::allocator<upb::MessageDefPtr>> *)
                     &this_file_messages,
                     (iterator)
                     this_file_messages.
                     super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
                     _M_impl.super__Vector_impl_data._M_finish,pMVar37);
        }
        else {
          (this_file_messages.
           super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
           super__Vector_impl_data._M_finish)->ptr_ = pMVar37->ptr_;
          this_file_messages.
          super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
          super__Vector_impl_data._M_finish =
               this_file_messages.
               super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      pMVar37 = pMVar37 + 1;
    } while (pMVar37 != pMVar29);
  }
  SortedExtensions(&this_file_exts,(FileDefPtr)pools);
  SortedEnums(&this_file_enums,(FileDefPtr)pools,kAllEnums);
  pMVar29 = this_file_messages.
            super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
            super__Vector_impl_data._M_finish;
  p_Var31 = &forward_messages_1._M_t._M_impl.super__Rb_tree_header;
  forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (ulong)(uint)forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ << 0x20;
  forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var31->_M_header;
  forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var31->_M_header;
  if (this_file_messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      this_file_messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pMVar37 = this_file_messages.
              super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      puVar21 = pMVar37->ptr_;
      for (iVar38 = 0; iVar11 = upb_MessageDef_FieldCount(puVar21), iVar38 < iVar11;
          iVar38 = iVar38 + 1) {
        puVar15 = upb_MessageDef_Field(puVar21,iVar38);
        uVar12 = upb_FieldDef_CType(puVar15);
        if (uVar12 == kUpb_CType_Message) {
          puVar16 = upb_FieldDef_File(puVar15);
          puVar17 = upb_FieldDef_MessageSubDef(puVar15);
          puVar18 = upb_MessageDef_File(puVar17);
          if (puVar16 != puVar18) {
            puVar17 = upb_FieldDef_MessageSubDef(puVar15);
            m = upb_FieldDef_MessageSubDef(puVar15);
            pcVar19 = upb_MessageDef_FullName(m);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&values,pcVar19,(allocator<char> *)&local_1b8);
            pmVar20 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::MessageDefPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::MessageDefPtr>_>_>
                      ::operator[](&forward_messages_1,(key_type *)&values);
            pmVar20->ptr_ = puVar17;
            if (values.super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                (pointer)&values.
                          super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(values.
                              super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (ulong)((long)&(values.
                                              super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                             ptr_ + 1));
            }
          }
        }
      }
      pMVar37 = pMVar37 + 1;
    } while (pMVar37 != pMVar29);
  }
  pFVar45 = this_file_exts.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (this_file_exts.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl
      .super__Vector_impl_data._M_start !=
      this_file_exts.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    pFVar39 = this_file_exts.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      puVar15 = pFVar39->ptr_;
      puVar16 = upb_FieldDef_File(puVar15);
      puVar21 = upb_FieldDef_ContainingType(puVar15);
      puVar18 = upb_MessageDef_File(puVar21);
      if (puVar16 != puVar18) {
        puVar21 = upb_FieldDef_ContainingType(puVar15);
        puVar17 = upb_FieldDef_ContainingType(puVar15);
        pcVar19 = upb_MessageDef_FullName(puVar17);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&values,pcVar19,(allocator<char> *)&local_1b8);
        pmVar20 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::MessageDefPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::MessageDefPtr>_>_>
                  ::operator[](&forward_messages_1,(key_type *)&values);
        pmVar20->ptr_ = puVar21;
        if (values.super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (pointer)&values.
                      super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(values.
                          super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&(values.
                                          super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->ptr_
                                 + 1));
        }
      }
      pFVar39 = pFVar39 + 1;
    } while (pFVar39 != pFVar45);
  }
  forward_messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  forward_messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  forward_messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>::reserve
            (&forward_messages,forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
  p_Var1 = &forward_messages_1._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      p_Var1) {
    p_Var22 = forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      if (forward_messages.
          super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          forward_messages.
          super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<upb::MessageDefPtr,std::allocator<upb::MessageDefPtr>>::
        _M_realloc_insert<upb::MessageDefPtr_const&>
                  ((vector<upb::MessageDefPtr,std::allocator<upb::MessageDefPtr>> *)
                   &forward_messages,
                   (iterator)
                   forward_messages.
                   super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(MessageDefPtr *)(p_Var22 + 2));
      }
      else {
        (forward_messages.
         super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
         super__Vector_impl_data._M_finish)->ptr_ =
             (upb_MessageDef *)*(upb_MessageDef **)(p_Var22 + 2);
        forward_messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             forward_messages.
             super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      p_Var22 = (_Base_ptr)std::_Rb_tree_increment(p_Var22);
    } while ((_Rb_tree_header *)p_Var22 != p_Var1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::MessageDefPtr>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::MessageDefPtr>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::MessageDefPtr>_>_>
  ::~_Rb_tree(&forward_messages_1._M_t);
  pcVar19 = upb_FileDef_Name((upb_FileDef *)pools);
  pgVar23 = (generator *)strlen(pcVar19);
  filename_01._M_str = (char *)p_Var31;
  filename_01._M_len = (size_t)pcVar19;
  FileWarning_abi_cxx11_((string *)&forward_messages_1,pgVar23,filename_01);
  format._M_str = (char *)forward_messages_1._M_t._M_impl._0_8_;
  format._M_len = forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  Output::operator()<>(&h_output,format);
  if ((_Base_ptr *)forward_messages_1._M_t._M_impl._0_8_ !=
      &forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)forward_messages_1._M_t._M_impl._0_8_,
                    (ulong)((long)&(forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  pcVar19 = upb_FileDef_Name((upb_FileDef *)pools);
  pgVar23 = (generator *)strlen(pcVar19);
  filename_02._M_str = (char *)p_Var31;
  filename_02._M_len = (size_t)pcVar19;
  IncludeGuard_abi_cxx11_((string *)&forward_messages_1,pgVar23,filename_02);
  FVar32.ptr_ = (upb_FieldDef *)&forward_messages_1;
  format_00._M_str =
       "#ifndef $0_UPB_H_\n#define $0_UPB_H_\n\n#include \"upb/generated_code_support.h\"\n\n";
  format_00._M_len = 0x4e;
  Output::operator()(&h_output,format_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FVar32.ptr_);
  if ((_Base_ptr *)forward_messages_1._M_t._M_impl._0_8_ !=
      &forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)forward_messages_1._M_t._M_impl._0_8_,
                    (ulong)((long)&(forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  for (iVar38 = 0; iVar11 = upb_FileDef_PublicDependencyCount((upb_FileDef *)pools), iVar38 < iVar11
      ; iVar38 = iVar38 + 1) {
    if (iVar38 == 0) {
      format_01._M_str = "/* Public Imports. */\n";
      format_01._M_len = 0x16;
      Output::operator()<>(&h_output,format_01);
    }
    puVar16 = upb_FileDef_PublicDependency((upb_FileDef *)pools,iVar38);
    pcVar19 = upb_FileDef_Name(puVar16);
    pgVar23 = (generator *)strlen(pcVar19);
    proto_filename._M_str._0_4_ = ~*(uint *)&(file.ptr_)->opts >> 0x1f;
    proto_filename._M_len = (size_t)pcVar19;
    proto_filename._M_str._4_4_ = 0;
    CApiHeaderFilename_abi_cxx11_
              ((string *)&forward_messages_1,pgVar23,proto_filename,SUB81(context,0));
    format_02._M_str = "#include \"$0\"\n";
    format_02._M_len = 0xe;
    FVar32.ptr_ = (upb_FieldDef *)&forward_messages_1;
    Output::operator()(&h_output,format_02,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &forward_messages_1);
    if ((_Base_ptr *)forward_messages_1._M_t._M_impl._0_8_ !=
        &forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)forward_messages_1._M_t._M_impl._0_8_,
                      (ulong)((long)&(forward_messages_1._M_t._M_impl.super__Rb_tree_header.
                                      _M_header._M_parent)->_M_color + 1));
    }
  }
  iVar38 = upb_FileDef_PublicDependencyCount((upb_FileDef *)pools);
  if (0 < iVar38) {
    format_03._M_str = "\n";
    format_03._M_len = 1;
    Output::operator()<>(&h_output,format_03);
  }
  if (*(int *)&(file.ptr_)->opts != 0) {
    pcVar19 = upb_FileDef_Name((upb_FileDef *)pools);
    pgVar23 = (generator *)strlen(pcVar19);
    proto_filename_00._M_str._0_4_ = ~*(uint *)&(file.ptr_)->opts >> 0x1f;
    proto_filename_00._M_len = (size_t)pcVar19;
    proto_filename_00._M_str._4_4_ = 0;
    MiniTableHeaderFilename_abi_cxx11_
              ((string *)&forward_messages_1,pgVar23,proto_filename_00,SUB81(context,0));
    FVar32.ptr_ = (upb_FieldDef *)&forward_messages_1;
    format_04._M_str = "#include \"$0\"\n\n";
    format_04._M_len = 0xf;
    Output::operator()(&h_output,format_04,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       FVar32.ptr_);
    if ((_Base_ptr *)forward_messages_1._M_t._M_impl._0_8_ !=
        &forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)forward_messages_1._M_t._M_impl._0_8_,
                      (ulong)((long)&(forward_messages_1._M_t._M_impl.super__Rb_tree_header.
                                      _M_header._M_parent)->_M_color + 1));
    }
    for (iVar38 = 0; iVar11 = upb_FileDef_DependencyCount((upb_FileDef *)pools), iVar38 < iVar11;
        iVar38 = iVar38 + 1) {
      if (*(char *)((long)&(file.ptr_)->opts + 4) == '\x01') {
        puVar16 = upb_FileDef_Dependency((upb_FileDef *)pools,iVar38);
        pcVar19 = upb_FileDef_Name(puVar16);
        pcVar24 = (compiler *)strlen(pcVar19);
        filename._M_str = extraout_RDX;
        filename._M_len = (size_t)pcVar19;
        bVar9 = google::protobuf::compiler::IsKnownFeatureProto(pcVar24,filename);
        if (!bVar9) goto LAB_0027bb3b;
      }
      else {
LAB_0027bb3b:
        puVar16 = upb_FileDef_Dependency((upb_FileDef *)pools,iVar38);
        pcVar19 = upb_FileDef_Name(puVar16);
        pgVar23 = (generator *)strlen(pcVar19);
        proto_filename_01._M_str._0_4_ = ~*(uint *)&(file.ptr_)->opts >> 0x1f;
        proto_filename_01._M_len = (size_t)pcVar19;
        proto_filename_01._M_str._4_4_ = 0;
        MiniTableHeaderFilename_abi_cxx11_
                  ((string *)&forward_messages_1,pgVar23,proto_filename_01,SUB81(context,0));
        format_05._M_str = "#include \"$0\"\n";
        format_05._M_len = 0xe;
        FVar32.ptr_ = (upb_FieldDef *)&forward_messages_1;
        Output::operator()(&h_output,format_05,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &forward_messages_1);
        if ((_Base_ptr *)forward_messages_1._M_t._M_impl._0_8_ !=
            &forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)forward_messages_1._M_t._M_impl._0_8_,
                          (ulong)((long)&(forward_messages_1._M_t._M_impl.super__Rb_tree_header.
                                          _M_header._M_parent)->_M_color + 1));
        }
      }
    }
    format_06._M_str = "\n";
    format_06._M_len = 1;
    Output::operator()<>(&h_output,format_06);
  }
  format_07._M_str =
       "// Must be last.\n#include \"upb/port/def.inc\"\n\n#ifdef __cplusplus\nextern \"C\" {\n#endif\n\n"
  ;
  format_07._M_len = 0x56;
  Output::operator()<>(&h_output,format_07);
  pMVar29 = this_file_messages.
            super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
            super__Vector_impl_data._M_finish;
  MVar36.ptr_ = extraout_RDX_00;
  if (*(int *)&(file.ptr_)->opts == 0) {
    if (this_file_messages.
        super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
        super__Vector_impl_data._M_start !=
        this_file_messages.
        super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pMVar37 = this_file_messages.
                super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        pcVar19 = upb_MessageDef_FullName(pMVar37->ptr_);
        pgVar23 = (generator *)strlen(pcVar19);
        full_name._M_str = (char *)FVar32.ptr_;
        full_name._M_len = (size_t)pcVar19;
        MiniTableMessageVarName_abi_cxx11_((string *)&forward_messages_1,pgVar23,full_name);
        format_08._M_str = "extern const upb_MiniTable* $0(void);\n";
        format_08._M_len = 0x26;
        FVar32.ptr_ = (upb_FieldDef *)&forward_messages_1;
        Output::operator()(&h_output,format_08,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &forward_messages_1);
        if ((_Base_ptr *)forward_messages_1._M_t._M_impl._0_8_ !=
            &forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)forward_messages_1._M_t._M_impl._0_8_,
                          (ulong)((long)&(forward_messages_1._M_t._M_impl.super__Rb_tree_header.
                                          _M_header._M_parent)->_M_color + 1));
        }
        pMVar37 = pMVar37 + 1;
      } while (pMVar37 != pMVar29);
    }
    pMVar29 = forward_messages.
              super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (forward_messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        forward_messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pMVar37 = forward_messages.
                super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        pcVar19 = upb_MessageDef_FullName(pMVar37->ptr_);
        pgVar23 = (generator *)strlen(pcVar19);
        full_name_00._M_str = (char *)FVar32.ptr_;
        full_name_00._M_len = (size_t)pcVar19;
        MiniTableMessageVarName_abi_cxx11_((string *)&forward_messages_1,pgVar23,full_name_00);
        format_09._M_str = "extern const upb_MiniTable* $0(void);\n";
        format_09._M_len = 0x26;
        FVar32.ptr_ = (upb_FieldDef *)&forward_messages_1;
        Output::operator()(&h_output,format_09,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &forward_messages_1);
        if ((_Base_ptr *)forward_messages_1._M_t._M_impl._0_8_ !=
            &forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)forward_messages_1._M_t._M_impl._0_8_,
                          (ulong)((long)&(forward_messages_1._M_t._M_impl.super__Rb_tree_header.
                                          _M_header._M_parent)->_M_color + 1));
        }
        pMVar37 = pMVar37 + 1;
      } while (pMVar37 != pMVar29);
    }
    pEVar7 = this_file_enums.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pEVar42 = (pointer)CONCAT44(this_file_enums.
                                super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                (uint32_t)
                                this_file_enums.
                                super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>
                                ._M_impl.super__Vector_impl_data._M_start);
    if (pEVar42 !=
        this_file_enums.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        pcVar19 = upb_EnumDef_FullName(pEVar42->ptr_);
        pgVar23 = (generator *)strlen(pcVar19);
        full_name_01._M_str = (char *)FVar32.ptr_;
        full_name_01._M_len = (size_t)pcVar19;
        MiniTableEnumVarName_abi_cxx11_((string *)&forward_messages_1,pgVar23,full_name_01);
        format_10._M_str = "extern const upb_MiniTableEnum* $0(void);\n";
        format_10._M_len = 0x2a;
        FVar32.ptr_ = (upb_FieldDef *)&forward_messages_1;
        Output::operator()(&h_output,format_10,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &forward_messages_1);
        if ((_Base_ptr *)forward_messages_1._M_t._M_impl._0_8_ !=
            &forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)forward_messages_1._M_t._M_impl._0_8_,
                          (ulong)((long)&(forward_messages_1._M_t._M_impl.super__Rb_tree_header.
                                          _M_header._M_parent)->_M_color + 1));
        }
        pEVar42 = pEVar42 + 1;
      } while (pEVar42 != pEVar7);
    }
    format_11._M_str = "\n";
    format_11._M_len = 1;
    Output::operator()<>(&h_output,format_11);
    MVar36.ptr_ = extraout_RDX_01;
  }
  pMVar29 = this_file_messages.
            super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (this_file_messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      this_file_messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pMVar37 = this_file_messages.
              super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      (anonymous_namespace)::MessageType_abi_cxx11_
                ((string *)&forward_messages_1,(_anonymous_namespace_ *)pMVar37->ptr_,MVar36);
      format_12._M_str = "typedef struct $0 { upb_Message UPB_PRIVATE(base); } $0;\n";
      format_12._M_len = 0x39;
      FVar32.ptr_ = (upb_FieldDef *)&forward_messages_1;
      Output::operator()(&h_output,format_12,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &forward_messages_1);
      MVar36.ptr_ = extraout_RDX_02;
      if ((_Base_ptr *)forward_messages_1._M_t._M_impl._0_8_ !=
          &forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)forward_messages_1._M_t._M_impl._0_8_,
                        (ulong)((long)&(forward_messages_1._M_t._M_impl.super__Rb_tree_header.
                                        _M_header._M_parent)->_M_color + 1));
        MVar36.ptr_ = extraout_RDX_03;
      }
      pMVar37 = pMVar37 + 1;
    } while (pMVar37 != pMVar29);
  }
  pMVar29 = forward_messages.
            super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (forward_messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      forward_messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pMVar37 = forward_messages.
              super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      (anonymous_namespace)::MessageType_abi_cxx11_
                ((string *)&forward_messages_1,(_anonymous_namespace_ *)pMVar37->ptr_,MVar36);
      format_13._M_str = "struct $0;\n";
      format_13._M_len = 0xb;
      FVar32.ptr_ = (upb_FieldDef *)&forward_messages_1;
      Output::operator()(&h_output,format_13,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &forward_messages_1);
      MVar36.ptr_ = extraout_RDX_04;
      if ((_Base_ptr *)forward_messages_1._M_t._M_impl._0_8_ !=
          &forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)forward_messages_1._M_t._M_impl._0_8_,
                        (ulong)((long)&(forward_messages_1._M_t._M_impl.super__Rb_tree_header.
                                        _M_header._M_parent)->_M_color + 1));
        MVar36.ptr_ = extraout_RDX_05;
      }
      pMVar37 = pMVar37 + 1;
    } while (pMVar37 != pMVar29);
  }
  if (this_file_messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      this_file_messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    format_14._M_str = "\n";
    format_14._M_len = 1;
    Output::operator()<>(&h_output,format_14);
  }
  pEVar42 = (pointer)CONCAT44(this_file_enums.
                              super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (uint32_t)
                              this_file_enums.
                              super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                              _M_impl.super__Vector_impl_data._M_start);
  local_d0 = (upb_MessageDef *)
             this_file_enums.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (pEVar42 !=
      this_file_enums.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      puVar30 = pEVar42->ptr_;
      format_15._M_str = "typedef enum {\n";
      format_15._M_len = 0xf;
      Output::operator()<>(&h_output,format_15);
      values.super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      values.super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      values.super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar38 = upb_EnumDef_ValueCount(puVar30);
      std::vector<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>::reserve
                (&values,(long)iVar38);
      for (iVar38 = 0; iVar11 = upb_EnumDef_ValueCount(puVar30),
          pEVar6 = values.
                   super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
          pEVar5 = values.
                   super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
                   _M_impl.super__Vector_impl_data._M_start, iVar38 < iVar11; iVar38 = iVar38 + 1) {
        forward_messages_1._M_t._M_impl._0_8_ = upb_EnumDef_Value(puVar30,iVar38);
        std::vector<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>::
        emplace_back<upb::EnumValDefPtr>(&values,(EnumValDefPtr *)&forward_messages_1);
      }
      if (values.super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>._M_impl
          .super__Vector_impl_data._M_start !=
          values.super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>._M_impl
          .super__Vector_impl_data._M_finish) {
        lVar25 = (long)values.
                       super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)values.
                       super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        FVar32.ptr_ = (upb_FieldDef *)-(lVar25 + 1 >> 0x3f);
        std::
        _Temporary_buffer<__gnu_cxx::__normal_iterator<upb::EnumValDefPtr_*,_std::vector<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>_>,_upb::EnumValDefPtr>
        ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<upb::EnumValDefPtr_*,_std::vector<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>_>,_upb::EnumValDefPtr>
                             *)&forward_messages_1,
                            (__normal_iterator<upb::EnumValDefPtr_*,_std::vector<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>_>
                             )values.
                              super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                            (long)&((_Alloc_hider *)&(FVar32.ptr_)->opts)->_M_p + lVar25 + 1 >> 1);
        if (forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
            (_Base_ptr)0x0) {
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<upb::EnumValDefPtr*,std::vector<upb::EnumValDefPtr,std::allocator<upb::EnumValDefPtr>>>,__gnu_cxx::__ops::_Iter_comp_iter<upb::generator::(anonymous_namespace)::DumpEnumValues(upb::EnumDefPtr,upb::generator::Output&)::__0>>
                    (pEVar5,pEVar6);
        }
        else {
          FVar32.ptr_ = (upb_FieldDef *)
                        forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<upb::EnumValDefPtr*,std::vector<upb::EnumValDefPtr,std::allocator<upb::EnumValDefPtr>>>,upb::EnumValDefPtr*,long,__gnu_cxx::__ops::_Iter_comp_iter<upb::generator::(anonymous_namespace)::DumpEnumValues(upb::EnumDefPtr,upb::generator::Output&)::__0>>
                    (pEVar5,pEVar6);
        }
        operator_delete(forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                        forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ << 3);
      }
      if (values.super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>._M_impl
          .super__Vector_impl_data._M_finish !=
          values.super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>._M_impl
          .super__Vector_impl_data._M_start) {
        uVar43 = 0;
        do {
          v = values.super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar43].ptr_;
          pcVar19 = upb_EnumValueDef_FullName(v);
          pgVar23 = (generator *)strlen(pcVar19);
          full_name_02._M_str = (char *)FVar32.ptr_;
          full_name_02._M_len = (size_t)pcVar19;
          CApiEnumValueSymbol_abi_cxx11_((string *)&forward_messages_1,pgVar23,full_name_02);
          iVar13 = upb_EnumValueDef_Number(v);
          local_1b8._0_4_ = iVar13;
          context = (GeneratorContext *)&local_1b8;
          format_16._M_str = "  $0 = $1";
          format_16._M_len = 9;
          FVar32.ptr_ = (upb_FieldDef *)&forward_messages_1;
          Output::operator()(&h_output,format_16,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &forward_messages_1,(int *)context);
          if ((_Base_ptr *)forward_messages_1._M_t._M_impl._0_8_ !=
              &forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
            operator_delete((void *)forward_messages_1._M_t._M_impl._0_8_,
                            (ulong)((long)&(forward_messages_1._M_t._M_impl.super__Rb_tree_header.
                                            _M_header._M_parent)->_M_color + 1));
          }
          if (uVar43 != ((long)values.
                               super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)values.
                               super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U) {
            format_17._M_str = ",";
            format_17._M_len = 1;
            Output::operator()<>(&h_output,format_17);
          }
          format_18._M_str = "\n";
          format_18._M_len = 1;
          Output::operator()<>(&h_output,format_18);
          uVar43 = uVar43 + 1;
        } while (uVar43 < (ulong)((long)values.
                                        super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)values.
                                        super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      if (values.super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(values.
                        super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)values.
                              super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)values.
                              super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pcVar19 = upb_EnumDef_FullName(puVar30);
      pgVar23 = (generator *)strlen(pcVar19);
      full_name_03._M_str = (char *)FVar32.ptr_;
      full_name_03._M_len = (size_t)pcVar19;
      CApiEnumType_abi_cxx11_((string *)&forward_messages_1,pgVar23,full_name_03);
      format_19._M_str = "} $0;\n\n";
      format_19._M_len = 7;
      FVar32.ptr_ = (upb_FieldDef *)&forward_messages_1;
      Output::operator()(&h_output,format_19,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &forward_messages_1);
      if ((_Base_ptr *)forward_messages_1._M_t._M_impl._0_8_ !=
          &forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)forward_messages_1._M_t._M_impl._0_8_,
                        (ulong)((long)&(forward_messages_1._M_t._M_impl.super__Rb_tree_header.
                                        _M_header._M_parent)->_M_color + 1));
      }
      pEVar42 = pEVar42 + 1;
    } while ((upb_MessageDef *)pEVar42 != local_d0);
  }
  format_20._M_str = "\n";
  format_20._M_len = 1;
  Output::operator()<>(&h_output,format_20);
  format_21._M_str = "\n";
  format_21._M_len = 1;
  Output::operator()<>(&h_output,format_21);
  pMVar29 = this_file_messages.
            super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
            super__Vector_impl_data._M_finish;
  field_03.ptr_ = extraout_RDX_06;
  if (this_file_messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      this_file_messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pMVar37 = this_file_messages.
              super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      FVar32.ptr_ = (upb_FieldDef *)&h_output;
      GenerateMessageInHeader(pMVar37->ptr_,(DefPoolPair *)this,(Options *)file.ptr_,&h_output);
      pMVar37 = pMVar37 + 1;
      field_03.ptr_ = extraout_RDX_07;
    } while (pMVar37 != pMVar29);
  }
  if (this_file_exts.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl
      .super__Vector_impl_data._M_start !=
      this_file_exts.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    pFVar45 = this_file_exts.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      puVar15 = pFVar45->ptr_;
      (anonymous_namespace)::ExtensionIdentBase_abi_cxx11_
                ((string *)&forward_messages_1,(_anonymous_namespace_ *)puVar15,field_03);
      resolve_calls.output_._M_dataplus._M_p = upb_FieldDef_Name(puVar15);
      puVar21 = upb_FieldDef_ContainingType(puVar15);
      (anonymous_namespace)::MessageType_abi_cxx11_
                ((string *)&values,(_anonymous_namespace_ *)puVar21,descriptor);
      pcVar19 = upb_FieldDef_FullName(puVar15);
      pgVar23 = (generator *)strlen(pcVar19);
      full_name_04._M_str = (char *)FVar32.ptr_;
      full_name_04._M_len = (size_t)pcVar19;
      MiniTableExtensionVarName_abi_cxx11_((string *)&local_1b8,pgVar23,full_name_04);
      format_22._M_str =
           "\n        UPB_INLINE bool $0_has_$1(const struct $2* msg) {\n          return upb_Message_HasExtension((upb_Message*)msg, &$3);\n        }\n      "
      ;
      format_22._M_len = 0x8e;
      puVar33 = (upb_FieldDef *)&forward_messages_1;
      Output::operator()(&h_output,format_22,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &forward_messages_1,(char **)&resolve_calls,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &values,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_1b8);
      FVar32.ptr_ = extraout_RDX_08;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.oneof != &local_1a8) {
        operator_delete(local_1b8.oneof,local_1a8._M_allocated_capacity + 1);
        FVar32.ptr_ = extraout_RDX_09;
      }
      if (values.super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>._M_impl
          .super__Vector_impl_data._M_start !=
          (pointer)&values.
                    super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(values.
                        super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&(values.
                                        super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->ptr_ +
                               1));
        FVar32.ptr_ = extraout_RDX_10;
      }
      if ((_Base_ptr *)forward_messages_1._M_t._M_impl._0_8_ !=
          &forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)forward_messages_1._M_t._M_impl._0_8_,
                        (ulong)((long)&(forward_messages_1._M_t._M_impl.super__Rb_tree_header.
                                        _M_header._M_parent)->_M_color + 1));
        FVar32.ptr_ = extraout_RDX_11;
      }
      (anonymous_namespace)::ExtensionIdentBase_abi_cxx11_
                ((string *)&forward_messages_1,(_anonymous_namespace_ *)puVar15,FVar32);
      resolve_calls.output_._M_dataplus._M_p = upb_FieldDef_Name(puVar15);
      puVar21 = upb_FieldDef_ContainingType(puVar15);
      (anonymous_namespace)::MessageType_abi_cxx11_
                ((string *)&values,(_anonymous_namespace_ *)puVar21,descriptor_00);
      pcVar19 = upb_FieldDef_FullName(puVar15);
      pgVar23 = (generator *)strlen(pcVar19);
      full_name_05._M_str = (char *)puVar33;
      full_name_05._M_len = (size_t)pcVar19;
      MiniTableExtensionVarName_abi_cxx11_((string *)&local_1b8,pgVar23,full_name_05);
      context = (GeneratorContext *)&resolve_calls;
      format_23._M_str =
           "\n        UPB_INLINE void $0_clear_$1(struct $2* msg) {\n          upb_Message_ClearExtension((upb_Message*)msg, &$3);\n        }\n      "
      ;
      format_23._M_len = 0x85;
      FVar32.ptr_ = (upb_FieldDef *)&forward_messages_1;
      Output::operator()(&h_output,format_23,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &forward_messages_1,(char **)context,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &values,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.oneof != &local_1a8) {
        operator_delete(local_1b8.oneof,local_1a8._M_allocated_capacity + 1);
      }
      if (values.super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>._M_impl
          .super__Vector_impl_data._M_start !=
          (pointer)&values.
                    super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(values.
                        super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&(values.
                                        super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->ptr_ +
                               1));
      }
      if ((_Base_ptr *)forward_messages_1._M_t._M_impl._0_8_ !=
          &forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)forward_messages_1._M_t._M_impl._0_8_,
                        (ulong)((long)&(forward_messages_1._M_t._M_impl.super__Rb_tree_header.
                                        _M_header._M_parent)->_M_color + 1));
      }
      _Var8 = upb_FieldDef_IsRepeated(puVar15);
      field_03.ptr_ = extraout_RDX_12;
      if (!_Var8) {
        (anonymous_namespace)::CTypeInternal_abi_cxx11_
                  ((string *)&forward_messages_1,(_anonymous_namespace_ *)puVar15,(FieldDefPtr)0x1,
                   SUB81(FVar32.ptr_,0));
        (anonymous_namespace)::ExtensionIdentBase_abi_cxx11_
                  ((string *)&values,(_anonymous_namespace_ *)puVar15,field);
        local_38 = upb_FieldDef_Name(puVar15);
        puVar21 = upb_FieldDef_ContainingType(puVar15);
        (anonymous_namespace)::MessageType_abi_cxx11_
                  ((string *)&local_1b8,(_anonymous_namespace_ *)puVar21,descriptor_01);
        pcVar19 = upb_FieldDef_FullName(puVar15);
        pgVar23 = (generator *)strlen(pcVar19);
        full_name_06._M_str = (char *)FVar32.ptr_;
        full_name_06._M_len = (size_t)pcVar19;
        MiniTableExtensionVarName_abi_cxx11_(&resolve_calls.output_,pgVar23,full_name_06);
        (anonymous_namespace)::GetFieldRep_abi_cxx11_
                  (&local_f0,(_anonymous_namespace_ *)this,(DefPoolPair *)puVar15,FVar32);
        (anonymous_namespace)::FieldDefault_abi_cxx11_
                  (&c_output.output_,(_anonymous_namespace_ *)puVar15,field_00);
        format_24._M_str =
             "\n          UPB_INLINE $0 $1_$2(const struct $3* msg) {\n            const upb_MiniTableExtension* ext = &$4;\n            UPB_ASSUME(upb_MiniTableField_IsScalar(&ext->UPB_PRIVATE(field)));\n            UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableField_GetRep)(\n                           &ext->UPB_PRIVATE(field)) == $5);\n            $0 default_val = $6;\n            $0 ret;\n            _upb_Message_GetExtensionField((upb_Message*)msg, ext, &default_val, &ret);\n            return ret;\n          }\n        "
        ;
        format_24._M_len = 0x1f1;
        FVar32.ptr_ = (upb_FieldDef *)&forward_messages_1;
        Output::operator()(&h_output,format_24,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &forward_messages_1,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &values,&local_38,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1b8,&resolve_calls.output_,&local_f0,&c_output.output_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)c_output.output_._M_dataplus._M_p != &c_output.output_.field_2) {
          operator_delete(c_output.output_._M_dataplus._M_p,
                          CONCAT71(c_output.output_.field_2._M_allocated_capacity._1_7_,
                                   c_output.output_.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,
                          (ulong)(local_f0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)resolve_calls.output_._M_dataplus._M_p != &resolve_calls.output_.field_2) {
          operator_delete(resolve_calls.output_._M_dataplus._M_p,
                          CONCAT71(resolve_calls.output_.field_2._M_allocated_capacity._1_7_,
                                   resolve_calls.output_.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8.oneof != &local_1a8) {
          operator_delete(local_1b8.oneof,local_1a8._M_allocated_capacity + 1);
        }
        if (values.super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (pointer)&values.
                      super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(values.
                          super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&(values.
                                          super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->ptr_
                                 + 1));
        }
        if ((_Base_ptr *)forward_messages_1._M_t._M_impl._0_8_ !=
            &forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)forward_messages_1._M_t._M_impl._0_8_,
                          (ulong)((long)&(forward_messages_1._M_t._M_impl.super__Rb_tree_header.
                                          _M_header._M_parent)->_M_color + 1));
        }
        (anonymous_namespace)::CTypeInternal_abi_cxx11_
                  ((string *)&forward_messages_1,(_anonymous_namespace_ *)puVar15,(FieldDefPtr)0x1,
                   SUB81(FVar32.ptr_,0));
        (anonymous_namespace)::ExtensionIdentBase_abi_cxx11_
                  ((string *)&values,(_anonymous_namespace_ *)puVar15,field_01);
        c_output.output_._M_dataplus._M_p = upb_FieldDef_Name(puVar15);
        puVar21 = upb_FieldDef_ContainingType(puVar15);
        (anonymous_namespace)::MessageType_abi_cxx11_
                  ((string *)&local_1b8,(_anonymous_namespace_ *)puVar21,descriptor_02);
        pcVar19 = upb_FieldDef_FullName(puVar15);
        pgVar23 = (generator *)strlen(pcVar19);
        full_name_07._M_str = (char *)FVar32.ptr_;
        full_name_07._M_len = (size_t)pcVar19;
        MiniTableExtensionVarName_abi_cxx11_(&resolve_calls.output_,pgVar23,full_name_07);
        (anonymous_namespace)::GetFieldRep_abi_cxx11_
                  (&local_f0,(_anonymous_namespace_ *)this,(DefPoolPair *)puVar15,FVar32);
        format_25._M_str =
             "\n          UPB_INLINE void $1_set_$2(struct $3* msg, $0 val, upb_Arena* arena) {\n            const upb_MiniTableExtension* ext = &$4;\n            UPB_ASSUME(upb_MiniTableField_IsScalar(&ext->UPB_PRIVATE(field)));\n            UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableField_GetRep)(\n                           &ext->UPB_PRIVATE(field)) == $5);\n            bool ok = upb_Message_SetExtension((upb_Message*)msg, ext, &val, arena);\n            UPB_ASSERT(ok);\n          }\n        "
        ;
        format_25._M_len = 0x1d7;
        FVar32.ptr_ = (upb_FieldDef *)&forward_messages_1;
        context = (GeneratorContext *)&values;
        Output::operator()(&h_output,format_25,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &forward_messages_1,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &values,(char **)&c_output,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1b8,&resolve_calls.output_,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,
                          (ulong)(local_f0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)resolve_calls.output_._M_dataplus._M_p != &resolve_calls.output_.field_2) {
          operator_delete(resolve_calls.output_._M_dataplus._M_p,
                          CONCAT71(resolve_calls.output_.field_2._M_allocated_capacity._1_7_,
                                   resolve_calls.output_.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8.oneof != &local_1a8) {
          operator_delete(local_1b8.oneof,local_1a8._M_allocated_capacity + 1);
        }
        if (values.super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (pointer)&values.
                      super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(values.
                          super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&(values.
                                          super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->ptr_
                                 + 1));
        }
        if ((_Base_ptr *)forward_messages_1._M_t._M_impl._0_8_ !=
            &forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)forward_messages_1._M_t._M_impl._0_8_,
                          (ulong)((long)&(forward_messages_1._M_t._M_impl.super__Rb_tree_header.
                                          _M_header._M_parent)->_M_color + 1));
        }
        _Var8 = upb_FieldDef_IsSubMessage(puVar15);
        field_03.ptr_ = extraout_RDX_13;
        if (_Var8) {
          puVar21 = upb_FieldDef_MessageSubDef(puVar15);
          (anonymous_namespace)::MessageType_abi_cxx11_
                    ((string *)&forward_messages_1,(_anonymous_namespace_ *)puVar21,descriptor_03);
          (anonymous_namespace)::ExtensionIdentBase_abi_cxx11_
                    ((string *)&values,(_anonymous_namespace_ *)puVar15,field_02);
          local_f0._M_dataplus._M_p = upb_FieldDef_Name(puVar15);
          puVar21 = upb_FieldDef_ContainingType(puVar15);
          (anonymous_namespace)::MessageType_abi_cxx11_
                    ((string *)&local_1b8,(_anonymous_namespace_ *)puVar21,descriptor_04);
          puVar21 = upb_FieldDef_MessageSubDef(puVar15);
          (anonymous_namespace)::MessageMiniTableRef_abi_cxx11_
                    (&resolve_calls.output_,(_anonymous_namespace_ *)puVar21,
                     (MessageDefPtr)file.ptr_,(Options *)FVar32.ptr_);
          format_26._M_str =
               "\n            UPB_INLINE struct $0* $1_mutable_$2(struct $3* msg,\n                                                upb_Arena* arena) {\n              struct $0* sub = (struct $0*)$1_$2(msg);\n              if (sub == NULL) {\n                sub = (struct $0*)_upb_Message_New($4, arena);\n                if (sub) $1_set_$2(msg, sub, arena);\n              }\n              return sub;\n            }\n          "
          ;
          format_26._M_len = 0x193;
          FVar32.ptr_ = (upb_FieldDef *)&forward_messages_1;
          context = (GeneratorContext *)&values;
          Output::operator()(&h_output,format_26,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &forward_messages_1,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &values,(char **)&local_f0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_1b8,&resolve_calls.output_);
          field_03.ptr_ = extraout_RDX_14;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)resolve_calls.output_._M_dataplus._M_p != &resolve_calls.output_.field_2) {
            operator_delete(resolve_calls.output_._M_dataplus._M_p,
                            CONCAT71(resolve_calls.output_.field_2._M_allocated_capacity._1_7_,
                                     resolve_calls.output_.field_2._M_local_buf[0]) + 1);
            field_03.ptr_ = extraout_RDX_15;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8.oneof != &local_1a8) {
            operator_delete(local_1b8.oneof,local_1a8._M_allocated_capacity + 1);
            field_03.ptr_ = extraout_RDX_16;
          }
          if (values.super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              (pointer)&values.
                        super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(values.
                            super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&(values.
                                            super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           ptr_ + 1));
            field_03.ptr_ = extraout_RDX_17;
          }
          if ((_Base_ptr *)forward_messages_1._M_t._M_impl._0_8_ !=
              &forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
            operator_delete((void *)forward_messages_1._M_t._M_impl._0_8_,
                            (ulong)((long)&(forward_messages_1._M_t._M_impl.super__Rb_tree_header.
                                            _M_header._M_parent)->_M_color + 1));
            field_03.ptr_ = extraout_RDX_18;
          }
        }
      }
      pFVar45 = pFVar45 + 1;
    } while (pFVar45 !=
             this_file_exts.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  pcVar19 = upb_FileDef_Name((upb_FileDef *)pools);
  sVar26 = strlen(pcVar19);
  if ((sVar26 == 0x20) &&
     (iVar38 = bcmp(pcVar19,"google/protobuf/descriptor.proto",0x20), iVar38 == 0)) {
LAB_0027c7ec:
    pMVar29 = this_file_messages.
              super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
              super__Vector_impl_data._M_finish;
    forward_messages_1._M_t._M_impl._0_8_ = 0;
    local_d0 = (upb_MessageDef *)0x0;
    values.super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_168 = (upb_MessageDef *)0x0;
    if (this_file_messages.
        super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
        super__Vector_impl_data._M_start !=
        this_file_messages.
        super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_168 = (upb_MessageDef *)0x0;
      local_d0 = (upb_MessageDef *)0x0;
      pMVar37 = this_file_messages.
                super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        MVar36.ptr_ = pMVar37->ptr_;
        pcVar19 = upb_MessageDef_Name(MVar36.ptr_);
        sVar26 = strlen(pcVar19);
        if ((6 < sVar26) &&
           (*(int *)(pcVar19 + (sVar26 - 4)) == 0x736e6f69 &&
            *(int *)(pcVar19 + (sVar26 - 7)) == 0x6974704f)) {
          puVar27 = DefPoolPair::GetMiniTable32((DefPoolPair *)this,MVar36);
          uVar2 = puVar27->size_dont_copy_me__upb_internal_use_only;
          puVar27 = DefPoolPair::GetMiniTable64((DefPoolPair *)this,MVar36);
          if ((ulong)forward_messages_1._M_t._M_impl._0_8_ < (ulong)uVar2) {
            forward_messages_1._M_t._M_impl._0_8_ = (ulong)uVar2;
            local_168 = MVar36.ptr_;
          }
          if (values.super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
              _M_impl.super__Vector_impl_data._M_start <
              (pointer)(ulong)puVar27->size_dont_copy_me__upb_internal_use_only) {
            values.super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)(ulong)puVar27->size_dont_copy_me__upb_internal_use_only;
            local_d0 = MVar36.ptr_;
          }
        }
        pMVar37 = pMVar37 + 1;
      } while (pMVar37 != pMVar29);
    }
    local_1b8.oneof = (upb_OneofDef *)upb_MessageDef_FullName(local_168);
    format_27._M_str = "/* Max size 32 is $0 */\n";
    format_27._M_len = 0x18;
    Output::operator()(&h_output,format_27,(char **)&local_1b8.oneof);
    local_1b8.oneof = (upb_OneofDef *)upb_MessageDef_FullName(local_d0);
    format_28._M_str = "/* Max size 64 is $0 */\n";
    format_28._M_len = 0x18;
    Output::operator()(&h_output,format_28,(char **)&local_1b8.oneof);
    FVar32.ptr_ = (upb_FieldDef *)&forward_messages_1;
    context = (GeneratorContext *)&values;
    format_29._M_str = "#define _UPB_MAXOPT_SIZE UPB_SIZE($0, $1)\n\n";
    format_29._M_len = 0x2b;
    Output::operator()(&h_output,format_29,(unsigned_long *)FVar32.ptr_,(unsigned_long *)context);
  }
  else {
    pcVar19 = upb_FileDef_Name((upb_FileDef *)pools);
    sVar26 = strlen(pcVar19);
    if ((sVar26 == 0x21) &&
       (iVar38 = bcmp(pcVar19,"net/proto2/proto/descriptor.proto",0x21), iVar38 == 0))
    goto LAB_0027c7ec;
  }
  pcVar19 = upb_FileDef_Name((upb_FileDef *)pools);
  pgVar23 = (generator *)strlen(pcVar19);
  filename_03._M_str = (char *)FVar32.ptr_;
  filename_03._M_len = (size_t)pcVar19;
  IncludeGuard_abi_cxx11_((string *)&forward_messages_1,pgVar23,filename_03);
  format_30._M_str =
       "#ifdef __cplusplus\n}  /* extern \"C\" */\n#endif\n\n#include \"upb/port/undef.inc\"\n\n#endif  /* $0_UPB_H_ */\n"
  ;
  format_30._M_len = 0x66;
  Output::operator()(&h_output,format_30,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &forward_messages_1);
  if ((_Base_ptr *)forward_messages_1._M_t._M_impl._0_8_ !=
      &forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)forward_messages_1._M_t._M_impl._0_8_,
                    (ulong)((long)&(forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  if (forward_messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(forward_messages.
                    super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)forward_messages.
                          super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)forward_messages.
                          super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar3 = (void *)CONCAT44(this_file_enums.
                            super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_4_,
                            (uint32_t)
                            this_file_enums.
                            super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                            _M_impl.super__Vector_impl_data._M_start);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)this_file_enums.
                                 super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar3);
  }
  if (this_file_exts.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(this_file_exts.
                    super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)this_file_exts.
                          super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)this_file_exts.
                          super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (this_file_messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(this_file_messages.
                    super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)this_file_messages.
                          super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)this_file_messages.
                          super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (sorted_messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sorted_messages.
                    super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)sorted_messages.
                          super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)sorted_messages.
                          super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pcVar19 = upb_FileDef_Name((upb_FileDef *)pools);
  pgVar23 = (generator *)strlen(pcVar19);
  proto_filename_02._M_str = (char *)0x0;
  proto_filename_02._M_len = (size_t)pcVar19;
  CApiHeaderFilename_abi_cxx11_
            ((string *)&forward_messages_1,pgVar23,proto_filename_02,SUB81(context,0));
  plVar28 = (long *)(**(code **)((long)*options + 0x10))(options,&forward_messages_1);
  if ((_Base_ptr *)forward_messages_1._M_t._M_impl._0_8_ !=
      &forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)forward_messages_1._M_t._M_impl._0_8_,
                    (ulong)((long)&(forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  src._M_str = h_output.output_._M_dataplus._M_p;
  src._M_len = h_output.output_._M_string_length;
  absl::lts_20250127::Cord::Cord((Cord *)&forward_messages_1,src,kConstructorString);
  cVar10 = (**(code **)(*plVar28 + 0x38))(plVar28,&forward_messages_1);
  if (cVar10 == '\0') {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&this_file_messages,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb_generator/c/generator.cc"
               ,0x476,"stream->WriteCord(absl::Cord(h_output.output()))");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&this_file_messages);
  }
  absl::lts_20250127::Cord::~Cord((Cord *)&forward_messages_1);
  (**(code **)(*plVar28 + 8))(plVar28);
  if (*(int *)&(file.ptr_)->opts == 0) {
    c_output.output_._M_dataplus._M_p = (pointer)&c_output.output_.field_2;
    c_output.output_._M_string_length = 0;
    c_output.output_.field_2._M_local_buf[0] = '\0';
    pcVar19 = upb_FileDef_Name((upb_FileDef *)pools);
    pgVar23 = (generator *)strlen(pcVar19);
    proto_filename_03._M_str._0_4_ = ~*(uint *)&(file.ptr_)->opts >> 0x1f;
    proto_filename_03._M_len = (size_t)pcVar19;
    proto_filename_03._M_str._4_4_ = 0;
    CApiHeaderFilename_abi_cxx11_
              ((string *)&forward_messages_1,pgVar23,proto_filename_03,SUB81(context,0));
    format_31._M_str =
         "#include <stddef.h>\n#include \"upb/generated_code_support.h\"\n#include \"$0\"\n\n";
    format_31._M_len = 0x4b;
    Output::operator()(&c_output,format_31,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &forward_messages_1);
    if ((_Base_ptr *)forward_messages_1._M_t._M_impl._0_8_ !=
        &forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)forward_messages_1._M_t._M_impl._0_8_,
                      (ulong)((long)&(forward_messages_1._M_t._M_impl.super__Rb_tree_header.
                                      _M_header._M_parent)->_M_color + 1));
    }
    iVar38 = upb_FileDef_DependencyCount((upb_FileDef *)pools);
    if (0 < iVar38) {
      iVar38 = 0;
      do {
        if (*(char *)((long)&(file.ptr_)->opts + 4) == '\x01') {
          puVar16 = upb_FileDef_Dependency((upb_FileDef *)pools,iVar38);
          pcVar19 = upb_FileDef_Name(puVar16);
          pcVar24 = (compiler *)strlen(pcVar19);
          filename_00._M_str = extraout_RDX_19;
          filename_00._M_len = (size_t)pcVar19;
          bVar9 = google::protobuf::compiler::IsKnownFeatureProto(pcVar24,filename_00);
          if (!bVar9) goto LAB_0027cc61;
        }
        else {
LAB_0027cc61:
          puVar16 = upb_FileDef_Dependency((upb_FileDef *)pools,iVar38);
          pcVar19 = upb_FileDef_Name(puVar16);
          pgVar23 = (generator *)strlen(pcVar19);
          proto_filename_04._M_str._0_4_ = ~*(uint *)&(file.ptr_)->opts >> 0x1f;
          proto_filename_04._M_len = (size_t)pcVar19;
          proto_filename_04._M_str._4_4_ = 0;
          CApiHeaderFilename_abi_cxx11_
                    ((string *)&forward_messages_1,pgVar23,proto_filename_04,SUB81(context,0));
          format_32._M_str = "#include \"$0\"\n";
          format_32._M_len = 0xe;
          Output::operator()(&c_output,format_32,(string *)&forward_messages_1);
          if ((_Base_ptr *)forward_messages_1._M_t._M_impl._0_8_ !=
              &forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
            operator_delete((void *)forward_messages_1._M_t._M_impl._0_8_,
                            (ulong)((long)&(forward_messages_1._M_t._M_impl.super__Rb_tree_header.
                                            _M_header._M_parent)->_M_color + 1));
          }
        }
        iVar11 = upb_FileDef_DependencyCount((upb_FileDef *)pools);
        iVar38 = iVar38 + 1;
      } while (iVar38 < iVar11);
    }
    format_33._M_str =
         "\n        static upb_Arena* upb_BootstrapArena() {\n          static upb_Arena* arena = NULL;\n          if (!arena) arena = upb_Arena_New();\n          return arena;\n        }\n      "
    ;
    format_33._M_len = 0xb3;
    Output::operator()<>(&c_output,format_33);
    format_34._M_str = "\n";
    format_34._M_len = 1;
    Output::operator()<>(&c_output,format_34);
    SortedMessages(&sorted_messages,(FileDefPtr)pools);
    options_00 = (AlphaNum *)
                 sorted_messages.
                 super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl
                 .super__Vector_impl_data._M_finish;
    if (sorted_messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        sorted_messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pMVar29 = sorted_messages.
                super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        this_file_exts.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)pMVar29->ptr_;
        resolve_calls.output_._M_dataplus._M_p = (pointer)&resolve_calls.output_.field_2;
        resolve_calls.output_._M_string_length = 0;
        resolve_calls.output_.field_2._M_local_buf[0] = '\0';
        for (iVar38 = 0;
            iVar11 = upb_MessageDef_FieldCount
                               ((upb_MessageDef *)
                                this_file_exts.
                                super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>
                                ._M_impl.super__Vector_impl_data._M_start), iVar38 < iVar11;
            iVar38 = iVar38 + 1) {
          puVar15 = upb_MessageDef_Field
                              ((upb_MessageDef *)
                               this_file_exts.
                               super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>
                               ._M_impl.super__Vector_impl_data._M_start,iVar38);
          puVar21 = upb_FieldDef_MessageSubDef(puVar15);
          if ((puVar21 != (upb_MessageDef *)0x0) ||
             (puVar30 = upb_FieldDef_EnumSubDef(puVar15), puVar30 != (upb_EnumDef *)0x0)) {
            puVar21 = upb_FieldDef_MessageSubDef(puVar15);
            if (puVar21 == (upb_MessageDef *)0x0) {
              puVar30 = upb_FieldDef_EnumSubDef(puVar15);
              if (puVar30 != (upb_EnumDef *)0x0) {
                puVar30 = upb_FieldDef_EnumSubDef(puVar15);
                _Var8 = upb_EnumDef_IsClosed(puVar30);
                if (_Var8) {
                  this_file_enums.
                  super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
                  super__Vector_impl_data._M_start._0_4_ = upb_FieldDef_Number(puVar15);
                  puVar30 = upb_FieldDef_EnumSubDef(puVar15);
                  if (*(int *)&(file.ptr_)->opts == 0) {
                    FVar35.ptr_ = file.ptr_;
                    pcVar19 = upb_EnumDef_FullName(puVar30);
                    pgVar23 = (generator *)strlen(pcVar19);
                    full_name_09._M_str = (char *)FVar35.ptr_;
                    full_name_09._M_len = (size_t)pcVar19;
                    MiniTableEnumVarName_abi_cxx11_((string *)&local_1b8,pgVar23,full_name_09);
                    forward_messages_1._M_t._M_impl._0_8_ = local_1b0;
                    forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                         local_1b8;
                    values.
                    super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
                    values.
                    super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x387629;
                    absl::lts_20250127::StrCat_abi_cxx11_
                              (&local_f0,(lts_20250127 *)&forward_messages_1,(AlphaNum *)&values,
                               (AlphaNum *)local_1b0.msgdef);
                  }
                  else {
                    forward_messages_1._M_t._M_impl._0_8_ = 1;
                    pcVar34 = "&";
                    forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                         (long)"&&" + 1;
                    pcVar19 = upb_EnumDef_FullName(puVar30);
                    pgVar23 = (generator *)strlen(pcVar19);
                    full_name_08._M_str = pcVar34;
                    full_name_08._M_len = (size_t)pcVar19;
                    MiniTableEnumVarName_abi_cxx11_((string *)&local_1b8,pgVar23,full_name_08);
                    values.
                    super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)local_1b0.msgdef;
                    values.
                    super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_1b8.oneof;
                    absl::lts_20250127::StrCat_abi_cxx11_
                              (&local_f0,(lts_20250127 *)&forward_messages_1,(AlphaNum *)&values,
                               (AlphaNum *)local_1b0.msgdef);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b8.oneof != &local_1a8) {
                    operator_delete(local_1b8.oneof,local_1a8._M_allocated_capacity + 1);
                  }
                  options_00 = (AlphaNum *)&this_file_enums;
                  format_36._M_str =
                       "upb_MiniTable_SetSubEnum(mini_table, (upb_MiniTableField*)upb_MiniTable_FindFieldByNumber(mini_table, $0), $1);\n  "
                  ;
                  format_36._M_len = 0x72;
                  Output::operator()(&resolve_calls,format_36,(uint *)options_00,&local_f0);
                  uVar40 = local_f0.field_2._M_allocated_capacity;
                  _Var41._M_p = local_f0._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f0._M_dataplus._M_p != &local_f0.field_2) goto LAB_0027ce3a;
                }
              }
            }
            else {
              uVar14 = upb_FieldDef_Number(puVar15);
              values.super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(values.
                                     super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar14);
              puVar21 = upb_FieldDef_MessageSubDef(puVar15);
              (anonymous_namespace)::MessageMiniTableRef_abi_cxx11_
                        ((string *)&forward_messages_1,(_anonymous_namespace_ *)puVar21,
                         (MessageDefPtr)file.ptr_,(Options *)options_00);
              format_35._M_str =
                   "upb_MiniTable_SetSubMessage(mini_table, (upb_MiniTableField*)upb_MiniTable_FindFieldByNumber(mini_table, $0), $1);\n  "
              ;
              format_35._M_len = 0x75;
              options_00 = (AlphaNum *)&values;
              Output::operator()(&resolve_calls,format_35,(uint *)&values,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&forward_messages_1);
              uVar40 = forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              _Var41._M_p = (pointer)forward_messages_1._M_t._M_impl._0_8_;
              if ((_Base_ptr *)forward_messages_1._M_t._M_impl._0_8_ !=
                  &forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
LAB_0027ce3a:
                operator_delete(_Var41._M_p,(ulong)((long)&((_Base_ptr)uVar40)->_M_color + 1));
              }
            }
          }
        }
        pcVar19 = upb_MessageDef_FullName
                            ((upb_MessageDef *)
                             this_file_exts.
                             super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>
                             ._M_impl.super__Vector_impl_data._M_start);
        pgVar23 = (generator *)strlen(pcVar19);
        full_name_10._M_str = (char *)options_00;
        full_name_10._M_len = (size_t)pcVar19;
        MiniTableMessageVarName_abi_cxx11_((string *)&forward_messages_1,pgVar23,full_name_10);
        MessageDefPtr::MiniDescriptorEncode_abi_cxx11_
                  ((string *)&values,(MessageDefPtr *)&this_file_exts);
        local_1b8 = (anon_union_8_2_184ffc0a_for_scope)resolve_calls.output_._M_string_length;
        local_1b0 = (anon_union_8_3_dbd58ed1_for_sub)resolve_calls.output_._M_dataplus._M_p;
        format_37._M_str =
             "\n        const upb_MiniTable* $0() {\n          static upb_MiniTable* mini_table = NULL;\n          static const char* mini_descriptor = \"$1\";\n          if (mini_table) return mini_table;\n          mini_table =\n              upb_MiniTable_Build(mini_descriptor, strlen(mini_descriptor),\n                                  upb_BootstrapArena(), NULL);\n          $2return mini_table;\n        }\n      "
        ;
        format_37._M_len = 0x18b;
        options_00 = (AlphaNum *)&forward_messages_1;
        Output::operator()(&c_output,format_37,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &forward_messages_1,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &values,(basic_string_view<char,_std::char_traits<char>_> *)&local_1b8);
        if (values.super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (pointer)&values.
                      super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(values.
                          super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&(values.
                                          super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->ptr_
                                 + 1));
        }
        if ((_Base_ptr *)forward_messages_1._M_t._M_impl._0_8_ !=
            &forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)forward_messages_1._M_t._M_impl._0_8_,
                          (ulong)((long)&(forward_messages_1._M_t._M_impl.super__Rb_tree_header.
                                          _M_header._M_parent)->_M_color + 1));
        }
        format_38._M_str = "\n";
        format_38._M_len = 1;
        Output::operator()<>(&c_output,format_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)resolve_calls.output_._M_dataplus._M_p != &resolve_calls.output_.field_2) {
          operator_delete(resolve_calls.output_._M_dataplus._M_p,
                          CONCAT71(resolve_calls.output_.field_2._M_allocated_capacity._1_7_,
                                   resolve_calls.output_.field_2._M_local_buf[0]) + 1);
        }
        pMVar29 = pMVar29 + 1;
      } while (pMVar29 !=
               sorted_messages.
               super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    if (sorted_messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(sorted_messages.
                      super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)sorted_messages.
                            super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)sorted_messages.
                            super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    SortedEnums((vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *)&local_1b8,
                (FileDefPtr)pools,kClosedEnums);
    aVar4 = local_1b0;
    FVar35.ptr_ = extraout_RDX_20;
    if ((upb_MessageDef *)local_1b8.oneof != local_1b0.msgdef) {
      aVar44 = local_1b8;
      do {
        resolve_calls.output_._M_dataplus._M_p = *(pointer *)&(aVar44.oneof)->opts;
        pcVar19 = upb_EnumDef_FullName((upb_EnumDef *)resolve_calls.output_._M_dataplus._M_p);
        pgVar23 = (generator *)strlen(pcVar19);
        full_name_11._M_str = (char *)options_00;
        full_name_11._M_len = (size_t)pcVar19;
        MiniTableEnumVarName_abi_cxx11_((string *)&forward_messages_1,pgVar23,full_name_11);
        EnumDefPtr::MiniDescriptorEncode_abi_cxx11_((string *)&values,(EnumDefPtr *)&resolve_calls);
        format_39._M_str =
             "\n        const upb_MiniTableEnum* $0() {\n          static const upb_MiniTableEnum* mini_table = NULL;\n          static const char* mini_descriptor = \"$1\";\n          if (mini_table) return mini_table;\n          mini_table =\n              upb_MiniTableEnum_Build(mini_descriptor, strlen(mini_descriptor),\n                                      upb_BootstrapArena(), NULL);\n          return mini_table;\n        }\n      "
        ;
        format_39._M_len = 0x19f;
        options_00 = (AlphaNum *)&forward_messages_1;
        Output::operator()(&c_output,format_39,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &forward_messages_1,(string *)&values);
        if (values.super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (pointer)&values.
                      super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(values.
                          super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&(values.
                                          super__Vector_base<upb::EnumValDefPtr,_std::allocator<upb::EnumValDefPtr>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->ptr_
                                 + 1));
        }
        if ((_Base_ptr *)forward_messages_1._M_t._M_impl._0_8_ !=
            &forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)forward_messages_1._M_t._M_impl._0_8_,
                          (ulong)((long)&(forward_messages_1._M_t._M_impl.super__Rb_tree_header.
                                          _M_header._M_parent)->_M_color + 1));
        }
        format_40._M_str = "\n";
        format_40._M_len = 1;
        Output::operator()<>(&c_output,format_40);
        aVar44.oneof = (upb_OneofDef *)&(aVar44.oneof)->resolved_features;
        FVar35.ptr_ = extraout_RDX_21;
      } while ((upb_MessageDef *)aVar44.oneof != aVar4.msgdef);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8.oneof !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_1b8.oneof,local_1a8._M_allocated_capacity - (long)local_1b8);
      FVar35.ptr_ = extraout_RDX_22;
    }
    (anonymous_namespace)::SourceFilename_abi_cxx11_
              ((string *)&forward_messages_1,(_anonymous_namespace_ *)pools,FVar35);
    plVar28 = (long *)(**(code **)((long)*options + 0x10))(options,&forward_messages_1);
    if ((_Base_ptr *)forward_messages_1._M_t._M_impl._0_8_ !=
        &forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)forward_messages_1._M_t._M_impl._0_8_,
                      (ulong)((long)&(forward_messages_1._M_t._M_impl.super__Rb_tree_header.
                                      _M_header._M_parent)->_M_color + 1));
    }
    src_01._M_str = c_output.output_._M_dataplus._M_p;
    src_01._M_len = c_output.output_._M_string_length;
    absl::lts_20250127::Cord::Cord((Cord *)&forward_messages_1,src_01,kConstructorString);
    cVar10 = (**(code **)(*plVar28 + 0x38))(plVar28,&forward_messages_1);
    if (cVar10 == '\0') {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&values,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb_generator/c/generator.cc"
                 ,0x47d,"stream->WriteCord(absl::Cord(c_output.output()))");
      goto LAB_0027d342;
    }
    absl::lts_20250127::Cord::~Cord((Cord *)&forward_messages_1);
    (**(code **)(*plVar28 + 8))(plVar28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)c_output.output_._M_dataplus._M_p != &c_output.output_.field_2) {
      operator_delete(c_output.output_._M_dataplus._M_p,
                      CONCAT71(c_output.output_.field_2._M_allocated_capacity._1_7_,
                               c_output.output_.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    (anonymous_namespace)::SourceFilename_abi_cxx11_
              ((string *)&forward_messages_1,(_anonymous_namespace_ *)pools,file_00);
    plVar28 = (long *)(**(code **)((long)*options + 0x10))(options,&forward_messages_1);
    if ((_Base_ptr *)forward_messages_1._M_t._M_impl._0_8_ !=
        &forward_messages_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)forward_messages_1._M_t._M_impl._0_8_,
                      (ulong)((long)&(forward_messages_1._M_t._M_impl.super__Rb_tree_header.
                                      _M_header._M_parent)->_M_color + 1));
    }
    src_00._M_str = "\n";
    src_00._M_len = 1;
    absl::lts_20250127::Cord::Cord((Cord *)&forward_messages_1,src_00,kConstructorString);
    cVar10 = (**(code **)(*plVar28 + 0x38))(plVar28,&forward_messages_1);
    if (cVar10 == '\0') {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&values,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb_generator/c/generator.cc"
                 ,0x483,"stream->WriteCord(absl::Cord(\"\\n\"))");
LAB_0027d342:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&values);
    }
    absl::lts_20250127::Cord::~Cord((Cord *)&forward_messages_1);
    (**(code **)(*plVar28 + 8))(plVar28);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)h_output.output_._M_dataplus._M_p != &h_output.output_.field_2) {
    operator_delete(h_output.output_._M_dataplus._M_p,
                    CONCAT71(h_output.output_.field_2._M_allocated_capacity._1_7_,
                             h_output.output_.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void GenerateFile(const DefPoolPair& pools, upb::FileDefPtr file,
                  const Options& options,
                  google::protobuf::compiler::GeneratorContext* context) {
  Output h_output;
  WriteHeader(pools, file, options, h_output);
  {
    auto stream =
        absl::WrapUnique(context->Open(CApiHeaderFilename(file.name(), false)));
    ABSL_CHECK(stream->WriteCord(absl::Cord(h_output.output())));
  }

  if (options.bootstrap_stage == 0) {
    Output c_output;
    WriteMiniDescriptorSource(pools, file, options, c_output);
    auto stream = absl::WrapUnique(context->Open(SourceFilename(file)));
    ABSL_CHECK(stream->WriteCord(absl::Cord(c_output.output())));
  } else {
    // TODO: remove once we can figure out how to make both Blaze
    // and Bazel happy with header-only libraries.

    auto stream = absl::WrapUnique(context->Open(SourceFilename(file)));
    ABSL_CHECK(stream->WriteCord(absl::Cord("\n")));
  }
}